

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

void AlphaVectorPlanning::ExportPOMDPFile(string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  int s0;
  uint uVar9;
  char *pcVar10;
  int s1;
  uint uVar11;
  int o;
  int s0_1;
  uint uVar12;
  double dVar13;
  string state;
  undefined1 local_250 [32];
  ofstream fp;
  byte abStack_210 [480];
  
  uVar1 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 0x68
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  uVar2 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 200)
          )(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  uVar3 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 0x30
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPOMDP::ExportPOMDPFile: failed to open file ");
    poVar6 = std::operator<<(poVar6,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::operator<<((ostream *)&fp,"discount: ");
  dVar13 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb0)) + 0x70))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  poVar6 = std::ostream::_M_insert<double>(dVar13);
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar4 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0)) + 0x80
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  if (iVar4 == 0) {
    pcVar10 = "values: reward";
  }
  else {
    if (iVar4 != 1) goto LAB_00417264;
    pcVar10 = "values: cost";
  }
  poVar6 = std::operator<<((ostream *)&fp,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00417264:
  std::operator<<((ostream *)&fp,"states:");
  uVar5 = ~((int)uVar3 >> 0x1f) & uVar3;
  for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    plVar7 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                           *(long *)(*(long *)decpomdp + -0xb8)) + 0x38))
                               (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar9);
    (**(code **)(*plVar7 + 0x18))(local_250,plVar7);
    std::operator+(&state,"s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    std::__cxx11::string::~string((string *)local_250);
    local_250[0] = 0x5f;
    _Var8 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )state._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(state._M_dataplus._M_p + state._M_string_length),
                       (_Iter_equals_val<const_char>)local_250);
    std::__cxx11::string::erase
              (&state,_Var8._M_current,state._M_dataplus._M_p + state._M_string_length);
    poVar6 = std::operator<<((ostream *)&fp," ");
    std::operator<<(poVar6,(string *)&state);
    std::__cxx11::string::~string((string *)&state);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  std::operator<<((ostream *)&fp,"actions:");
  uVar1 = ~((int)uVar1 >> 0x1f) & uVar1;
  for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
    plVar7 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                           *(long *)(*(long *)decpomdp + -0xb8)) + 0x80))
                               (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar9);
    (**(code **)(*plVar7 + 0x20))(local_250,plVar7);
    std::operator+(&state,"a",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    std::__cxx11::string::~string((string *)local_250);
    local_250[0] = 0x5f;
    _Var8 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )state._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(state._M_dataplus._M_p + state._M_string_length),
                       (_Iter_equals_val<const_char>)local_250);
    std::__cxx11::string::erase
              (&state,_Var8._M_current,state._M_dataplus._M_p + state._M_string_length);
    poVar6 = std::operator<<((ostream *)&fp," ");
    std::operator<<(poVar6,(string *)&state);
    std::__cxx11::string::~string((string *)&state);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  std::operator<<((ostream *)&fp,"observations:");
  uVar2 = ~((int)uVar2 >> 0x1f) & uVar2;
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    plVar7 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                           *(long *)(*(long *)decpomdp + -0xb8)) + 0xd8))
                               (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar9);
    (**(code **)(*plVar7 + 0x20))(local_250,plVar7);
    std::operator+(&state,"o",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    std::__cxx11::string::~string((string *)local_250);
    local_250[0] = 0x5f;
    _Var8 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )state._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(state._M_dataplus._M_p + state._M_string_length),
                       (_Iter_equals_val<const_char>)local_250);
    std::__cxx11::string::erase
              (&state,_Var8._M_current,state._M_dataplus._M_p + state._M_string_length);
    poVar6 = std::operator<<((ostream *)&fp," ");
    std::operator<<(poVar6,(string *)&state);
    std::__cxx11::string::~string((string *)&state);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  plVar7 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x50))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::operator<<((ostream *)&fp,"start: ");
  for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    dVar13 = (double)(**(code **)(*plVar7 + 0x10))(plVar7,uVar9);
    poVar6 = std::ostream::_M_insert<double>(dVar13);
    std::operator<<(poVar6," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
    for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
        dVar13 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0x108))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                    uVar12,uVar9,uVar11);
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          poVar6 = std::operator<<((ostream *)&fp,"T: ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar9);
          poVar6 = std::operator<<(poVar6," : ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar12);
          poVar6 = std::operator<<(poVar6," : ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar11);
          std::operator<<(poVar6," ");
          poVar6 = std::ostream::_M_insert<double>(dVar13);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
    }
  }
  for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
        dVar13 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0x118))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                    uVar3,uVar12,uVar9);
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          poVar6 = std::operator<<((ostream *)&fp,"O: ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar3);
          poVar6 = std::operator<<(poVar6," : ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar12);
          poVar6 = std::operator<<(poVar6," : ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar9);
          std::operator<<(poVar6," ");
          poVar6 = std::ostream::_M_insert<double>(dVar13);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
    }
  }
  for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      dVar13 = (double)(**(code **)(*(long *)decpomdp + 0xc0))(decpomdp,uVar2,uVar3);
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        poVar6 = std::operator<<((ostream *)&fp,"R: ");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar3);
        poVar6 = std::operator<<(poVar6," : ");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar2);
        std::operator<<(poVar6," : * : * ");
        poVar6 = std::ostream::_M_insert<double>(dVar13);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
  }
  std::ofstream::~ofstream(&fp);
  return;
}

Assistant:

void AlphaVectorPlanning::ExportPOMDPFile(const string & filename,
                                          const DecPOMDPDiscreteInterface *decpomdp)
{
    int nrA=decpomdp->GetNrJointActions(),
        nrO=decpomdp->GetNrJointObservations(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPOMDP::ExportPOMDPFile: failed to open file "
             << filename << endl;            
    }

    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    // Tony's parser chokes on "_" in names of
    // states/actions/observations, so we just remove them from the
    // strings.
    // Also, we have to ensure that strings don't start with a number,
    // which we solve by prepending each string with s/a/o.
    fp << "states:";
    for(int s=0;s<nrS;s++)
    {
        string state="s" + decpomdp->GetState(s)->SoftPrintBrief();
        state.erase(remove(state.begin(), state.end(), '_'),state.end());
        fp << " "  << state;
    }
    fp << endl;

    fp << "actions:";
    for(int a=0;a<nrA;a++)
    {
        string action="a" + decpomdp->GetJointAction(a)->SoftPrintBrief();
        action.erase(remove(action.begin(), action.end(), '_'),action.end());
        fp << " "  << action;
    }
    fp << endl;

    fp << "observations:";
    for(int o=0;o<nrO;o++)
    {
        string obs="o" + decpomdp->GetJointObservation(o)->SoftPrintBrief();
        obs.erase(remove(obs.begin(), obs.end(), '_'),obs.end());
        fp << " "  << obs;
    }
    fp << endl;


    StateDistribution* isd = decpomdp->GetISD();
    fp << "start: ";
    for(int s0=0;s0<nrS;s0++)
    {
        double bs = isd->GetProbability(s0);
        fp <<  bs << " ";
    }
    fp << endl;

    delete isd;

    double p;
    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                    fp << "T: " << a << " : " << s0 << " : " << s1 << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int o=0;o<nrO;o++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                    fp << "O: " << a << " : " << s1 << " : " << o << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
                fp << "R: " << a << " : " << s0 << " : * : * "
                   << p << endl;
        }

}